

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

string * __thiscall
fmt::format_abi_cxx11_(string *__return_storage_ptr__,fmt *this,CStringRef format_str,ArgList args)

{
  allocator<char> local_251;
  undefined1 local_250 [8];
  MemoryWriter w;
  ArgList args_local;
  CStringRef format_str_local;
  
  w.buffer_._528_8_ = format_str.data_;
  std::allocator<char>::allocator();
  BasicMemoryWriter<char,_std::allocator<char>_>::BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)local_250,&local_251);
  std::allocator<char>::~allocator(&local_251);
  BasicWriter<char>::write
            ((BasicWriter<char> *)local_250,(int)this,(void *)w.buffer_._528_8_,args.types_);
  BasicWriter<char>::str_abi_cxx11_(__return_storage_ptr__,(BasicWriter<char> *)local_250);
  BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter
            ((BasicMemoryWriter<char,_std::allocator<char>_> *)local_250);
  return __return_storage_ptr__;
}

Assistant:

inline std::string format(CStringRef format_str, ArgList args)
{
    MemoryWriter w;
    w.write(format_str, args);
    return w.str();
}